

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
          (ReferenceQuadRenderer *this,PixelBufferAccess *colorBuffer,PixelBufferAccess *depthBuffer
          ,PixelBufferAccess *stencilBuffer,IntegerQuad *quad,FragmentOperationState *state)

{
  int iVar1;
  int iVar2;
  ChannelType CVar3;
  ChannelType CVar4;
  ChannelType CVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ChannelType CVar9;
  int iVar10;
  FaceType faceType;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ChannelType CVar15;
  int iVar16;
  float yFactor;
  float fVar17;
  Vec4 color1;
  Vec4 color;
  MultisamplePixelBufferAccess local_f0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Fragment local_90;
  MultisamplePixelBufferAccess local_58;
  
  iVar1 = (quad->posA).m_data[0];
  iVar2 = (quad->posB).m_data[0];
  CVar3 = (quad->posA).m_data[1];
  CVar4 = (quad->posB).m_data[1];
  CVar5 = CVar4;
  if ((int)CVar3 < (int)CVar4) {
    CVar5 = CVar3;
  }
  CVar9 = CVar4;
  if ((int)CVar4 < (int)CVar3) {
    CVar9 = CVar3;
  }
  iVar6 = iVar2;
  if (iVar1 < iVar2) {
    iVar6 = iVar1;
  }
  iVar10 = iVar2;
  if (iVar2 < iVar1) {
    iVar10 = iVar1;
  }
  lVar12 = (long)iVar1 - (long)iVar2;
  lVar14 = -lVar12;
  if (0 < lVar12) {
    lVar14 = lVar12;
  }
  lVar13 = (long)(int)CVar3 - (long)(int)CVar4;
  lVar12 = -lVar13;
  if (0 < lVar13) {
    lVar12 = lVar13;
  }
  faceType = (FaceType)(iVar2 < iVar1 != (int)CVar4 < (int)CVar3);
  for (CVar15 = CVar5; (int)CVar15 <= (int)CVar9; CVar15 = CVar15 + SNORM_INT16) {
    yFactor = ((float)(int)(CVar15 - CVar5) + 0.5) / (float)((int)lVar12 + 1);
    if ((int)CVar4 < (int)CVar3) {
      yFactor = 1.0 - yFactor;
    }
    for (iVar16 = 0; iVar6 + iVar16 <= iVar10; iVar16 = iVar16 + 1) {
      fVar17 = ((float)iVar16 + 0.5) / (float)((int)lVar14 + 1);
      if (iVar2 < iVar1) {
        fVar17 = 1.0 - fVar17;
      }
      triQuadInterpolate<tcu::Vector<float,4>>
                ((FragmentOpUtil *)&local_a8,quad->color,fVar17,yFactor);
      triQuadInterpolate<tcu::Vector<float,4>>
                ((FragmentOpUtil *)&local_b8,quad->color1,fVar17,yFactor);
      fVar17 = triQuadInterpolate<float>(quad->depth,fVar17,yFactor);
      iVar11 = this->m_fragmentBufferSize;
      if (0x3ff < iVar11) {
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess
                  ((MultisamplePixelBufferAccess *)&local_90,colorBuffer);
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_f0,depthBuffer);
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_58,stencilBuffer);
        flushFragmentBuffer(this,(MultisamplePixelBufferAccess *)&local_90,&local_f0,&local_58,
                            faceType,state);
        iVar11 = this->m_fragmentBufferSize;
      }
      uVar8 = uStack_a0;
      uVar7 = local_a8;
      this->m_fragmentDepths[iVar11] = fVar17;
      local_c8 = local_b8;
      uStack_c0 = uStack_b0;
      local_f0.m_access.super_ConstPixelBufferAccess.m_format.order = iVar6 + iVar16;
      local_f0.m_access.super_ConstPixelBufferAccess.m_format.type = CVar15;
      tcu::Vector<int,_2>::Vector(&local_90.pixelCoord,(Vector<int,_2> *)&local_f0);
      local_90.value.v._0_8_ = uVar7;
      local_90.value.v._8_8_ = uVar8;
      local_90.value1.v._0_8_ = local_c8;
      local_90.value1.v._8_8_ = uStack_c0;
      local_90.coverage = 1;
      local_90.sampleDepths = this->m_fragmentDepths + iVar11;
      rr::Fragment::operator=(this->m_fragmentBuffer + this->m_fragmentBufferSize,&local_90);
      this->m_fragmentBufferSize = this->m_fragmentBufferSize + 1;
    }
  }
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess
            ((MultisamplePixelBufferAccess *)&local_90,colorBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_f0,depthBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_58,stencilBuffer);
  flushFragmentBuffer(this,(MultisamplePixelBufferAccess *)&local_90,&local_f0,&local_58,faceType,
                      state);
  return;
}

Assistant:

void ReferenceQuadRenderer::render (const tcu::PixelBufferAccess&			colorBuffer,
									const tcu::PixelBufferAccess&			depthBuffer,
									const tcu::PixelBufferAccess&			stencilBuffer,
									const IntegerQuad&						quad,
									const rr::FragmentOperationState&		state)
{
	bool			flipX			= quad.posA.x() > quad.posB.x();
	bool			flipY			= quad.posA.y() > quad.posB.y();
	rr::FaceType	faceType		= flipX == flipY ? rr::FACETYPE_FRONT : rr::FACETYPE_BACK;
	int				xFirst			= flipX ? quad.posB.x() : quad.posA.x();
	int				xLast			= flipX ? quad.posA.x() : quad.posB.x();
	int				yFirst			= flipY ? quad.posB.y() : quad.posA.y();
	int				yLast			= flipY ? quad.posA.y() : quad.posB.y();
	float			width			= (float)(xLast - xFirst + 1);
	float			height			= (float)(yLast - yFirst + 1);

	for (int y = yFirst; y <= yLast; y++)
	{
		// Interpolation factor for y.
		float yRatio = (0.5f + (float)(y - yFirst)) / height;
		if (flipY)
			yRatio = 1.0f - yRatio;

		for (int x = xFirst; x <= xLast; x++)
		{
			// Interpolation factor for x.
			float xRatio = (0.5f + (float)(x - xFirst)) / width;
			if (flipX)
				xRatio = 1.0f - xRatio;

			tcu::Vec4	color	= triQuadInterpolate(quad.color, xRatio, yRatio);
			tcu::Vec4	color1	= triQuadInterpolate(quad.color1, xRatio, yRatio);
			float		depth	= triQuadInterpolate(quad.depth, xRatio, yRatio);

			// Interpolated color and depth.

			DE_STATIC_ASSERT(MAX_FRAGMENT_BUFFER_SIZE == DE_LENGTH_OF_ARRAY(m_fragmentBuffer));

			if (m_fragmentBufferSize >= MAX_FRAGMENT_BUFFER_SIZE)
				flushFragmentBuffer(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer),
									rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer),
									rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer), faceType, state);

			m_fragmentDepths[m_fragmentBufferSize] = depth;
			m_fragmentBuffer[m_fragmentBufferSize] = rr::Fragment(tcu::IVec2(x, y), rr::GenericVec4(color), rr::GenericVec4(color1), 1u /* coverage mask */, &m_fragmentDepths[m_fragmentBufferSize]);
			m_fragmentBufferSize++;
		}
	}

	flushFragmentBuffer(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer),
						rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer),
						rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer), faceType, state);
}